

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
           *this,undefined8 *state,long *next)

{
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
  sVar1;
  ushort uVar2;
  int iVar3;
  byte *pbVar4;
  char cVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  
  pbVar4 = (byte *)*state;
  iVar3 = *(int *)(this + 4);
  if (iVar3 != 0) {
    sVar1 = *this;
    uVar2 = *(ushort *)(this + 2);
    pbVar7 = pbVar4;
    iVar6 = iVar3;
    do {
      if (pbVar7 == (byte *)state[4]) goto LAB_001345c5;
      if (sVar1 == (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
                    )((*(ushort *)(state[10] + 0x10 + (ulong)*pbVar7 * 2) & uVar2) != 0))
      goto LAB_001345c9;
      pbVar7 = pbVar7 + 1;
      *state = pbVar7;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  cVar5 = (**(code **)(*next + 0x10))(next,state);
  if (cVar5 == '\0') {
    uVar8 = iVar3 - 1;
    do {
      uVar8 = uVar8 + 1;
      if (*(uint *)(this + 8) <= uVar8) goto LAB_001345c9;
      pbVar7 = (byte *)*state;
      if (pbVar7 == (byte *)state[4]) goto LAB_001345c5;
      if (*this == (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<false>>
                    )((*(ushort *)(this + 2) & *(ushort *)(state[10] + 0x10 + (ulong)*pbVar7 * 2))
                     != 0)) goto LAB_001345c9;
      *state = pbVar7 + 1;
      cVar5 = (**(code **)(*next + 0x10))(next,state);
    } while (cVar5 == '\0');
  }
  return true;
LAB_001345c5:
  *(undefined1 *)((long)state + 0x31) = 1;
LAB_001345c9:
  *state = pbVar4;
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }